

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_predefinedEntityName(ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = (long)end - (long)ptr;
  if (lVar3 == 4) {
    if (*ptr == 'a') {
      if (((ptr[1] == 'p') && (ptr[2] == 'o')) && (ptr[3] == 's')) {
        return 0x27;
      }
    }
    else if (((*ptr == 'q') && (ptr[1] == 'u')) && ((ptr[2] == 'o' && (ptr[3] == 't')))) {
      return 0x22;
    }
  }
  else if (lVar3 == 3) {
    if (((*ptr == 'a') && (ptr[1] == 'm')) && (ptr[2] == 'p')) {
      return 0x26;
    }
  }
  else if ((lVar3 == 2) && (ptr[1] == 't')) {
    iVar2 = 0x3e;
    if (*ptr != 'g') {
      iVar2 = 0;
    }
    iVar1 = 0x3c;
    if (*ptr != 'l') {
      iVar1 = iVar2;
    }
    return iVar1;
  }
  return 0;
}

Assistant:

static int PTRCALL
PREFIX(predefinedEntityName)(const ENCODING *enc, const char *ptr,
                             const char *end) {
  UNUSED_P(enc);
  switch ((end - ptr) / MINBPC(enc)) {
  case 2:
    if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_t)) {
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case ASCII_l:
        return ASCII_LT;
      case ASCII_g:
        return ASCII_GT;
      }
    }
    break;
  case 3:
    if (CHAR_MATCHES(enc, ptr, ASCII_a)) {
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_m)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_p))
          return ASCII_AMP;
      }
    }
    break;
  case 4:
    switch (BYTE_TO_ASCII(enc, ptr)) {
    case ASCII_q:
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_u)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_o)) {
          ptr += MINBPC(enc);
          if (CHAR_MATCHES(enc, ptr, ASCII_t))
            return ASCII_QUOT;
        }
      }
      break;
    case ASCII_a:
      ptr += MINBPC(enc);
      if (CHAR_MATCHES(enc, ptr, ASCII_p)) {
        ptr += MINBPC(enc);
        if (CHAR_MATCHES(enc, ptr, ASCII_o)) {
          ptr += MINBPC(enc);
          if (CHAR_MATCHES(enc, ptr, ASCII_s))
            return ASCII_APOS;
        }
      }
      break;
    }
  }
  return 0;
}